

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O2

int __thiscall gdsForge::GDSwriteRec(gdsForge *this,int record)

{
  ostream *poVar1;
  bool bVar2;
  uchar OHout [4];
  
  bVar2 = (char)record == '\0';
  if (bVar2) {
    fwrite(OHout,1,4,(FILE *)this->gdsFile);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "The smoke has escaped. The record must be dataless");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return (uint)!bVar2;
}

Assistant:

int gdsForge::GDSwriteRec(int record)
{
  unsigned char OHout[4];

  OHout[0] = 0;
  OHout[1] = 4;
  OHout[2] = record >> 8 & 0xff;
  OHout[3] = record & 0xff;

  if (OHout[3] != 0) {
    cout << "The smoke has escaped. The record must be dataless" << endl;
    return 1;
  }

  fwrite(OHout, 1, 4, this->gdsFile);

  return 0;
}